

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str.cpp
# Opt level: O0

void test_string_view<char>(void)

{
  basic_string_view<char,_std::char_traits<char>_> data;
  __tuple_element_t<1UL,_tuple<const_char_(&)[12],_basic_string<char>,_basic_string_view<char,_char_traits<char>_>,_const_char_(&)[23],_basic_string<char>,_basic_string_view<char,_char_traits<char>_>_>_>
  *rhs;
  __tuple_element_t<2UL,_tuple<const_char_(&)[12],_basic_string<char>,_basic_string_view<char,_char_traits<char>_>,_const_char_(&)[23],_basic_string<char>,_basic_string_view<char,_char_traits<char>_>_>_>
  *rhs_00;
  __tuple_element_t<4UL,_tuple<const_char_(&)[12],_basic_string<char>,_basic_string_view<char,_char_traits<char>_>,_const_char_(&)[23],_basic_string<char>,_basic_string_view<char,_char_traits<char>_>_>_>
  *rhs_01;
  basic_string<char> letItGo_1;
  basic_string<char> *local_570;
  BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  local_568;
  StringRef local_538;
  SourceLineInfo local_528;
  StringRef local_518;
  undefined1 local_508 [8];
  AssertionHandler catchAssertionHandler_5;
  basic_string<char> *local_4b8;
  BinaryExpr<const_frozen::basic_string<char>_&,_const_frozen::basic_string<char>_&> local_4b0;
  StringRef local_480;
  SourceLineInfo local_470;
  StringRef local_460;
  undefined1 local_450 [8];
  AssertionHandler catchAssertionHandler_4;
  basic_string<char> *local_400;
  BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[23]> local_3f8;
  StringRef local_3c8;
  SourceLineInfo local_3b8;
  StringRef local_3a8;
  undefined1 local_398 [8];
  AssertionHandler catchAssertionHandler_3;
  basic_string<char> local_340;
  Decomposer local_329;
  basic_string<char> *local_328;
  BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  local_320;
  StringRef local_2f0;
  SourceLineInfo local_2e0;
  StringRef local_2d0;
  undefined1 local_2c0 [8];
  AssertionHandler catchAssertionHandler_2;
  basic_string<char> *local_270;
  BinaryExpr<const_frozen::basic_string<char>_&,_const_frozen::basic_string<char>_&> local_268;
  StringRef local_238;
  SourceLineInfo local_228;
  StringRef local_218;
  undefined1 local_208 [8];
  AssertionHandler catchAssertionHandler_1;
  Decomposer local_1a9;
  basic_string<char> *local_1a8;
  BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[12]> local_1a0;
  StringRef local_170;
  SourceLineInfo local_160;
  StringRef local_150;
  undefined1 local_140 [8];
  AssertionHandler catchAssertionHandler;
  undefined1 local_e8 [8];
  basic_string<char> letItGo;
  type *letitgoletitgo_sv;
  type *letitgoletitgo_s;
  char (*letitgoletitgo) [23];
  type *letitgo_sv;
  type *letitgo_s;
  char (*letitgo) [12];
  undefined1 local_58 [8];
  tuple<const_char_(&)[12],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_(&)[23],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  strings;
  
  memcpy(local_58,&DAT_002d92b8,0x50);
  memcpy(&letitgo,local_58,0x50);
  rhs = std::
        get<1ul,char_const(&)[12],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>,char_const(&)[23],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>>
                  ((tuple<const_char_(&)[12],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_(&)[23],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&letitgo);
  rhs_00 = std::
           get<2ul,char_const(&)[12],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>,char_const(&)[23],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>>
                     ((tuple<const_char_(&)[12],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_(&)[23],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)&letitgo);
  rhs_01 = std::
           get<4ul,char_const(&)[12],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>,char_const(&)[23],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>>
                     ((tuple<const_char_(&)[12],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_(&)[23],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)&letitgo);
  letItGo.size_ =
       (size_t)std::
               get<5ul,char_const(&)[12],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>,char_const(&)[23],frozen::basic_string<char>,std::basic_string_view<char,std::char_traits<char>>>
                         ((tuple<const_char_(&)[12],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_(&)[23],_frozen::basic_string<char>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&letitgo);
  catchAssertionHandler.m_resultCapture = (IResultCapture *)rhs_00->_M_len;
  data._M_len = rhs_00->_M_len;
  data._M_str = rhs_00->_M_str;
  frozen::basic_string<char>::basic_string((basic_string<char> *)local_e8,data);
  local_150 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
             ,0x43);
  Catch::StringRef::StringRef(&local_170,"letItGo == letitgo");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_140,&local_150,&local_160,local_170,Normal);
  local_1a8 = (basic_string<char> *)
              Catch::Decomposer::operator<=(&local_1a9,(basic_string<char> *)local_e8);
  Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
            (&local_1a0,(ExprLhs<frozen::basic_string<char>const&> *)&local_1a8,
             (char (*) [12])"Let it go !");
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_140,&local_1a0.super_ITransientExpression);
  Catch::BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[12]>::~BinaryExpr(&local_1a0)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)local_140);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_140);
  local_218 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
             ,0x44);
  Catch::StringRef::StringRef(&local_238,"letItGo == letitgo_s");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_208,&local_218,&local_228,local_238,Normal);
  local_270 = (basic_string<char> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_2.m_resultCapture + 7),
                         (basic_string<char> *)local_e8);
  Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
            (&local_268,(ExprLhs<frozen::basic_string<char>const&> *)&local_270,rhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_208,&local_268.super_ITransientExpression);
  Catch::BinaryExpr<const_frozen::basic_string<char>_&,_const_frozen::basic_string<char>_&>::
  ~BinaryExpr(&local_268);
  Catch::AssertionHandler::complete((AssertionHandler *)local_208);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_208);
  local_2d0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2e0,
             "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
             ,0x45);
  Catch::StringRef::StringRef(&local_2f0,"letItGo == letitgo_sv");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2c0,&local_2d0,&local_2e0,local_2f0,Normal);
  local_328 = (basic_string<char> *)
              Catch::Decomposer::operator<=(&local_329,(basic_string<char> *)local_e8);
  Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
            (&local_320,(ExprLhs<frozen::basic_string<char>const&> *)&local_328,rhs_00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2c0,&local_320.super_ITransientExpression);
  Catch::
  BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  ::~BinaryExpr(&local_320);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2c0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2c0);
  catchAssertionHandler_3.m_resultCapture = *(IResultCapture **)letItGo.size_;
  frozen::basic_string<char>::basic_string
            (&local_340,*(basic_string_view<char,_std::char_traits<char>_> *)letItGo.size_);
  local_e8 = (undefined1  [8])local_340.data_;
  letItGo.data_ = (chr_t *)local_340.size_;
  local_3a8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_3b8,
             "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
             ,0x48);
  Catch::StringRef::StringRef(&local_3c8,"letItGo == letitgoletitgo");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_398,&local_3a8,&local_3b8,local_3c8,Normal);
  local_400 = (basic_string<char> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_4.m_resultCapture + 7),
                         (basic_string<char> *)local_e8);
  Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
            (&local_3f8,(ExprLhs<frozen::basic_string<char>const&> *)&local_400,
             (char (*) [23])"Let it go, let it go !");
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_398,&local_3f8.super_ITransientExpression);
  Catch::BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[23]>::~BinaryExpr(&local_3f8)
  ;
  Catch::AssertionHandler::complete((AssertionHandler *)local_398);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_398);
  local_460 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_470,
             "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
             ,0x49);
  Catch::StringRef::StringRef(&local_480,"letItGo == letitgoletitgo_s");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_450,&local_460,&local_470,local_480,Normal);
  local_4b8 = (basic_string<char> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_5.m_resultCapture + 7),
                         (basic_string<char> *)local_e8);
  Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
            (&local_4b0,(ExprLhs<frozen::basic_string<char>const&> *)&local_4b8,rhs_01);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_450,&local_4b0.super_ITransientExpression);
  Catch::BinaryExpr<const_frozen::basic_string<char>_&,_const_frozen::basic_string<char>_&>::
  ~BinaryExpr(&local_4b0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_450);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_450);
  local_518 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_528,
             "/workspace/llm4binary/github/license_c_cmakelists/serge-sans-paille[P]frozen/tests/test_str.cpp"
             ,0x4a);
  Catch::StringRef::StringRef(&local_538,"letItGo == letitgoletitgo_sv");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_508,&local_518,&local_528,local_538,Normal);
  local_570 = (basic_string<char> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&letItGo_1.size_ + 7),(basic_string<char> *)local_e8);
  Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
            (&local_568,(ExprLhs<frozen::basic_string<char>const&> *)&local_570,
             (basic_string_view<char,_std::char_traits<char>_> *)letItGo.size_);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_508,&local_568.super_ITransientExpression);
  Catch::
  BinaryExpr<const_frozen::basic_string<char>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_&>
  ::~BinaryExpr(&local_568);
  Catch::AssertionHandler::complete((AssertionHandler *)local_508);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_508);
  return;
}

Assistant:

void test_string_view() {
#ifdef FROZEN_LETITGO_HAS_STRING_VIEW
  constexpr auto strings = []() -> std::tuple<
    const Char(&)[12], frozen::basic_string<Char>, std::basic_string_view<Char>,
    const Char(&)[23], frozen::basic_string<Char>, std::basic_string_view<Char>
  > {
    if constexpr (std::is_same_v<char, Char>) {
      return {
        "Let it go !", "Let it go !"_s, "Let it go !"sv,
        "Let it go, let it go !", "Let it go, let it go !"_s, "Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<wchar_t, Char>) {
      return {
        L"Let it go !", L"Let it go !"_s, L"Let it go !"sv,
        L"Let it go, let it go !", L"Let it go, let it go !"_s, L"Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<char16_t, Char>) {
      return {
        u"Let it go !", u"Let it go !"_s, u"Let it go !"sv,
        u"Let it go, let it go !", u"Let it go, let it go !"_s, u"Let it go, let it go !"sv
      };
    } else if constexpr (std::is_same_v<char32_t, Char>) {
      return {
        U"Let it go !", U"Let it go !"_s, U"Let it go !"sv,
        U"Let it go, let it go !", U"Let it go, let it go !"_s, U"Let it go, let it go !"sv
      };
    }
#ifdef FROZEN_LETITGO_HAS_CHAR8T
    else if constexpr (std::is_same_v<char8_t, Char>) {
      return {
        u8"Let it go !", u8"Let it go !"_s, u8"Let it go !"sv,
        u8"Let it go, let it go !", u8"Let it go, let it go !"_s, u8"Let it go, let it go !"sv
      };
    }
#endif
  }();
  
  const auto [
    letitgo,
    letitgo_s,
    letitgo_sv,
    letitgoletitgo,
    letitgoletitgo_s,
    letitgoletitgo_sv
  ] = strings;

  {
    frozen::basic_string<Char> letItGo = letitgo_sv;
    REQUIRE(letItGo == letitgo);
    REQUIRE(letItGo == letitgo_s);
    REQUIRE(letItGo == letitgo_sv);

    letItGo = letitgoletitgo_sv;
    REQUIRE(letItGo == letitgoletitgo);
    REQUIRE(letItGo == letitgoletitgo_s);
    REQUIRE(letItGo == letitgoletitgo_sv);
  }

  {
    constexpr frozen::basic_string<Char> letItGo = std::get<2>(strings);
    static_assert(letItGo == std::get<0>(strings), "frozen::string constexpr");
    static_assert(letItGo == std::get<1>(strings), "frozen::string constexpr literal");
    static_assert(letItGo == std::get<2>(strings), "frozen::string constexpr string view");
  }
#endif
}